

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comper.h
# Opt level: O0

bool ClownLZSS::Internal::Comper::Compress<std::ofstream>
               (uchar *data,size_t data_size,
               CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  type pCVar5;
  size_t length;
  size_t distance;
  ClownLZSS_Match *match;
  DescriptorFieldWriter<decltype(output)> descriptor_bits;
  size_t local_40;
  size_t total_matches;
  Matches matches;
  uint bytes_per_value;
  CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output_local;
  size_t data_size_local;
  uchar *data_local;
  
  matches._M_t.super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
  super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
  super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl._4_4_ = 2;
  if ((data_size & 1) == 0) {
    std::unique_ptr<ClownLZSS_Match[],ClownLZSS::Internal::MatchDeleter>::
    unique_ptr<ClownLZSS::Internal::MatchDeleter,void>
              ((unique_ptr<ClownLZSS_Match[],ClownLZSS::Internal::MatchDeleter> *)&total_matches);
    bVar4 = FindOptimalMatches(-1,0x100,0x100,
                               (_func_void_uchar_ptr_size_t_size_t_ClownLZSS_GraphEdge_ptr_void_ptr
                                *)0x0,0x11,GetMatchCost,data,2,data_size >> 1,
                               (Matches *)&total_matches,&local_40,(void *)0x0);
    if (bVar4) {
      BitField::
      DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
      ::DescriptorFieldWriter
                ((DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
                  *)&match,output);
      distance = (size_t)std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::
                         operator[]((unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>
                                     *)&total_matches,0);
      while( true ) {
        pCVar5 = std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::operator[]
                           ((unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter> *)
                            &total_matches,local_40);
        if ((type)distance == pCVar5) break;
        if (*(long *)distance == *(long *)(distance + 8) + 1) {
          BitField::
          WriterBase<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
          ::Push((WriterBase<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                  *)&match,false);
          OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   *)output,data[*(long *)(distance + 8) * 2]);
          OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   *)output,data[*(long *)(distance + 8) * 2 + 1]);
        }
        else {
          uVar1 = *(undefined8 *)distance;
          uVar2 = *(undefined8 *)(distance + 8);
          uVar3 = *(undefined8 *)(distance + 0x10);
          BitField::
          WriterBase<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
          ::Push((WriterBase<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                  *)&match,true);
          OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   *)output,-((char)uVar2 - (char)uVar1));
          OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   *)output,(char)uVar3 + 0xff);
        }
        distance = distance + 0x18;
      }
      BitField::
      WriterBase<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
      ::Push((WriterBase<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
              *)&match,true);
      OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               *)output,'\0');
      OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               *)output,'\0');
      data_local._7_1_ = true;
      descriptor_bits.descriptor_position._M_state.__count = 1;
      BitField::
      DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
      ::~DescriptorFieldWriter
                ((DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
                  *)&match);
    }
    else {
      data_local._7_1_ = false;
      descriptor_bits.descriptor_position._M_state.__count = 1;
    }
    std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::~unique_ptr
              ((unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter> *)&total_matches);
  }
  else {
    data_local._7_1_ = false;
  }
  return data_local._7_1_;
}

Assistant:

bool Compress(const unsigned char* const data, const std::size_t data_size, CompressorOutput<T> &output)
			{
				constexpr unsigned int bytes_per_value = 2;

				// Cannot compress data that is an odd number of bytes long.
				if (data_size % bytes_per_value != 0)
					return false;

				// Produce a series of LZSS compression matches.
				ClownLZSS::Matches matches;
				std::size_t total_matches;
				if (!ClownLZSS::FindOptimalMatches(-1, 0x100, 0x100, nullptr, 1 + 16, GetMatchCost, data, bytes_per_value, data_size / bytes_per_value, &matches, &total_matches, nullptr))
					return false;

				DescriptorFieldWriter<decltype(output)> descriptor_bits(output);

				// Produce Comper-formatted data.
				for (ClownLZSS_Match *match = &matches[0]; match != &matches[total_matches]; ++match)
				{
					if (CLOWNLZSS_MATCH_IS_LITERAL(match))
					{
						descriptor_bits.Push(0);
						output.Write(data[match->destination * 2 + 0]);
						output.Write(data[match->destination * 2 + 1]);
					}
					else
					{
						const std::size_t distance = match->destination - match->source;
						const std::size_t length = match->length;

						descriptor_bits.Push(1);
						output.Write(-distance & 0xFF);
						output.Write(length - 1);
					}
				}

				// Add the terminator match.
				descriptor_bits.Push(1);
				output.Write(0);
				output.Write(0);

				return true;
			}